

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

void * __thiscall MixedArena::allocSpace(MixedArena *this,size_t size,size_t align)

{
  bool bVar1;
  pthread_t pVar2;
  pointer ppvVar3;
  void *pvVar4;
  pthread_t pVar5;
  MixedArena *this_00;
  MixedArena *allocated;
  ulong uVar6;
  __base_type local_38;
  __pointer_type seen;
  
  pVar2 = pthread_self();
  pVar5 = (this->threadId)._M_thread;
  if (pVar2 == pVar5) {
    uVar6 = -align & (this->index + align) - 1;
    this->index = uVar6;
    if ((0x8000 < uVar6 + size) ||
       (ppvVar3 = (this->chunks).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_finish,
       ppvVar3 ==
       (this->chunks).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
       super__Vector_impl_data._M_start)) {
      if ((size + 0x7fff & 0xffffffffffff8000) < size) {
        __assert_fail("size <= numChunks * CHUNK_SIZE",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                      ,0x7e,"void *MixedArena::allocSpace(size_t, size_t)");
      }
      local_38._M_p = (__pointer_type)aligned_alloc(0x10);
      if (local_38._M_p == (__pointer_type)0x0) {
        abort();
      }
      std::vector<void_*,_std::allocator<void_*>_>::push_back(&this->chunks,&local_38._M_p);
      ppvVar3 = (this->chunks).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      uVar6 = 0;
    }
    pvVar4 = (void *)((long)ppvVar3[-1] + uVar6);
    this->index = size + uVar6;
  }
  else {
    this_00 = (MixedArena *)0x0;
    while (pVar2 != pVar5) {
      local_38._M_p = (this->next)._M_b._M_p;
      if (local_38._M_p == (__pointer_type)0x0) {
        if (this_00 == (MixedArena *)0x0) {
          this_00 = (MixedArena *)operator_new(0x30);
          MixedArena(this_00);
        }
        bVar1 = std::atomic<MixedArena_*>::compare_exchange_strong
                          (&this->next,&local_38._M_p,this_00,memory_order_seq_cst);
        if (bVar1) goto LAB_0012a448;
      }
      this = local_38._M_p;
      pVar5 = ((local_38._M_p)->threadId)._M_thread;
    }
    if (this_00 != (MixedArena *)0x0) {
      ~MixedArena(this_00);
      operator_delete(this_00,0x30);
    }
LAB_0012a448:
    pvVar4 = allocSpace(this,size,align);
  }
  return pvVar4;
}

Assistant:

void* allocSpace(size_t size, size_t align) {
    // the bump allocator data should not be modified by multiple threads at
    // once.
    auto myId = std::this_thread::get_id();
    if (myId != threadId) {
      MixedArena* curr = this;
      MixedArena* allocated = nullptr;
      while (myId != curr->threadId) {
        auto seen = curr->next.load();
        if (seen) {
          curr = seen;
          continue;
        }
        // there is a nullptr for next, so we may be able to place a new
        // allocator for us there. but carefully, as others may do so as
        // well. we may waste a few allocations here, but it doesn't matter
        // as this can only happen as the chain is built up, i.e.,
        // O(# of cores) per allocator, and our allocatrs are long-lived.
        if (!allocated) {
          allocated = new MixedArena(); // has our thread id
        }
        if (curr->next.compare_exchange_strong(seen, allocated)) {
          // we replaced it, so we are the next in the chain
          // we can forget about allocated, it is owned by the chain now
          allocated = nullptr;
          break;
        }
        // otherwise, the cmpxchg updated seen, and we continue to loop
        curr = seen;
      }
      if (allocated) {
        delete allocated;
      }
      return curr->allocSpace(size, align);
    }
    // First, move the current index in the last chunk to an aligned position.
    index = (index + align - 1) & (-align);
    if (index + size > CHUNK_SIZE || chunks.size() == 0) {
      // Allocate a new chunk.
      auto numChunks = (size + CHUNK_SIZE - 1) / CHUNK_SIZE;
      assert(size <= numChunks * CHUNK_SIZE);
      auto* allocation =
        wasm::aligned_malloc(MAX_ALIGN, numChunks * CHUNK_SIZE);
      if (!allocation) {
        abort();
      }
      chunks.push_back(allocation);
      index = 0;
    }
    uint8_t* ret = static_cast<uint8_t*>(chunks.back());
    ret += index;
    index += size; // TODO: if we allocated more than 1 chunk, reuse the
                   // remainder, right now we allocate another next time
    return static_cast<void*>(ret);
  }